

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_secp256k1.cpp
# Opt level: O2

void __thiscall
Secp256k1_RangeProofInfoSecp256k1Test_Test::Secp256k1_RangeProofInfoSecp256k1Test_Test
          (Secp256k1_RangeProofInfoSecp256k1Test_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0070afa0;
  return;
}

Assistant:

TEST(Secp256k1, RangeProofInfoSecp256k1Test) {
  struct secp256k1_context_struct *ctx = wally_get_secp_context();
  Secp256k1 secp = Secp256k1(ctx);

  for (const RangeProofInfoTestVector& test_vector : range_proof_info_test_vectors) {
    int exponent;
    int mantissa;
    uint64_t min_value;
    uint64_t max_value;
    EXPECT_NO_THROW(secp.RangeProofInfoSecp256k1(test_vector.range_proof, &exponent, &mantissa, &min_value, &max_value));
    EXPECT_EQ(test_vector.expect_exp, exponent);
    EXPECT_EQ(test_vector.expect_mantissa, mantissa);
    EXPECT_EQ(test_vector.expect_minv, min_value);
    EXPECT_EQ(test_vector.expect_maxv, max_value);
  }
}